

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorPrimitiveCase::render
          (ScissorPrimitiveCase *this,GLuint program,IVec4 *param_2)

{
  allocator<unsigned_short> *this_00;
  deUint16 dVar1;
  int iVar2;
  PrimitiveType PVar3;
  float *pfVar4;
  glUniform4fvFunc p_Var5;
  int iVar6;
  int iVar7;
  GLint GVar8;
  undefined4 extraout_var;
  reference pvVar9;
  reference pvVar10;
  Vec4 *this_01;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_180;
  float local_178;
  int local_124;
  int ndx_1;
  int ndx;
  int vertNdx;
  float dy;
  float dx;
  int primNdx;
  Random rng;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  allocator<float> local_c9;
  undefined1 local_c8 [8];
  vector<float,_std::allocator<float>_> positions;
  float scale;
  int indexCount;
  int vertexCount;
  float *basePositions;
  deUint16 baseIndices [6];
  int indexCountSet [4];
  int vertexCountSet [4];
  float *positionSet [4];
  Vec4 primitiveArea;
  Vec4 white;
  Functions *gl;
  IVec4 *param_6_local;
  GLuint program_local;
  ScissorPrimitiveCase *this_local;
  Functions *gl_00;
  
  iVar6 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(primitiveArea.m_data + 2),1.0,1.0,1.0,1.0);
  this_01 = &this->m_renderArea;
  fVar11 = tcu::Vector<float,_4>::x(this_01);
  fVar12 = tcu::Vector<float,_4>::x(this_01);
  fVar13 = tcu::Vector<float,_4>::z(this_01);
  fVar14 = tcu::Vector<float,_4>::w(this_01);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(positionSet + 3),fVar11 + fVar11 + -1.0,fVar12 + fVar12 + -1.0,
             fVar13 + fVar13,fVar14 + fVar14);
  positionSet[1] = render::triPositions;
  positionSet[2] = render::quadPositions;
  positionSet[0] = render::linePositions;
  indexCountSet[2] = 1;
  indexCountSet[3] = 2;
  stack0xffffffffffffff78 = 0x200000001;
  indexCountSet[0] = 3;
  indexCountSet[1] = 6;
  baseIndices[0] = 1;
  baseIndices[1] = 3;
  pfVar4 = positionSet[(ulong)this->m_primitiveType - 1];
  iVar6 = indexCountSet[(ulong)this->m_primitiveType + 2];
  iVar2 = *(int *)(baseIndices + (ulong)this->m_primitiveType * 2 + 4);
  fVar11 = ::deFloatSqrt((float)this->m_primitiveCount + (float)this->m_primitiveCount);
  positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1.44 / fVar11;
  iVar7 = this->m_primitiveCount;
  std::allocator<float>::allocator(&local_c9);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_c8,(long)(iVar6 * iVar7 * 4),&local_c9);
  std::allocator<float>::~allocator(&local_c9);
  iVar7 = this->m_primitiveCount;
  this_00 = (allocator<unsigned_short> *)((long)&rng.m_rnd.z + 3);
  std::allocator<unsigned_short>::allocator(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w,
             (long)(iVar2 * iVar7),this_00);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&rng.m_rnd.z + 3));
  de::Random::Random((Random *)&dx,0x4d2);
  for (dy = 0.0; (int)dy < this->m_primitiveCount; dy = (float)((int)dy + 1)) {
    if (this->m_primitiveCount < 2) {
      local_178 = 0.0;
    }
    else {
      local_178 = de::Random::getFloat((Random *)&dx);
    }
    if (this->m_primitiveCount < 2) {
      local_180 = 0.0;
    }
    else {
      local_180 = de::Random::getFloat((Random *)&dx);
    }
    for (ndx_1 = 0; ndx_1 < iVar6; ndx_1 = ndx_1 + 1) {
      iVar7 = (int)dy * 4 * iVar6 + ndx_1 * 4;
      fVar11 = pfVar4[ndx_1 << 1] *
               positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(positionSet + 3));
      fVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(positionSet + 3));
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_c8,(long)iVar7);
      *pvVar9 = (fVar11 + local_178) * fVar12 + fVar13;
      fVar11 = pfVar4[ndx_1 * 2 + 1] *
               positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
      fVar12 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(positionSet + 3));
      fVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(positionSet + 3));
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_c8,(long)(iVar7 + 1));
      *pvVar9 = (fVar11 + local_180) * fVar12 + fVar13;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_c8,(long)(iVar7 + 2));
      *pvVar9 = 0.2;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_c8,(long)(iVar7 + 3));
      *pvVar9 = 1.0;
    }
    for (local_124 = 0; local_124 < iVar2; local_124 = local_124 + 1) {
      dVar1 = baseIndices[(long)local_124 + -4];
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w,
                           (long)((int)dy * iVar2 + local_124));
      *pvVar10 = dVar1 + SUB42(dy,0) * (short)iVar6;
    }
  }
  p_Var5 = gl_00->uniform4fv;
  GVar8 = (*gl_00->getUniformLocation)(program,"u_color");
  (*p_Var5)(GVar8,1,primitiveArea.m_data + 2);
  PVar3 = this->m_primitiveType;
  if (PVar3 == POINT) {
    drawPrimitives(gl_00,program,0,(vector<float,_std::allocator<float>_> *)local_c8,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w);
  }
  else if (PVar3 == LINE) {
    drawPrimitives(gl_00,program,1,(vector<float,_std::allocator<float>_> *)local_c8,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w);
  }
  else if (PVar3 == TRIANGLE) {
    drawPrimitives(gl_00,program,4,(vector<float,_std::allocator<float>_> *)local_c8,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w);
  }
  de::Random::~Random((Random *)&dx);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rng.m_rnd.w);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_c8);
  return;
}

Assistant:

void ScissorPrimitiveCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const Vec4					white			(1.0f, 1.0f, 1.0f, 1.0);
	const Vec4					primitiveArea	(m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.z()*2.0f,
												 m_renderArea.w()*2.0f);

	static const float quadPositions[] =
	{
		 0.0f,  1.0f,
		 0.0f,  0.0f,
		 1.0f,  1.0f,
		 1.0f,  0.0f
	};
	static const float triPositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  0.0f,
		 0.5f,  1.0f,
	};
	static const float linePositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  1.0f
	};
	static const float pointPosition[] =
	{
		 0.5f,  0.5f
	};

	const float*		positionSet[]	= { pointPosition, linePositions, triPositions, quadPositions };
	const int			vertexCountSet[]= { 1, 2, 3, 4 };
	const int			indexCountSet[]	= { 1, 2, 3, 6 };

	const deUint16		baseIndices[]	= { 0, 1, 2, 2, 1, 3 };
	const float*		basePositions	= positionSet[m_primitiveType];
	const int			vertexCount		= vertexCountSet[m_primitiveType];
	const int			indexCount		= indexCountSet[m_primitiveType];

	const float			scale			= 1.44f/deFloatSqrt(float(m_primitiveCount)*2.0f); // Magic value to roughly fill the render area with primitives at a readable density
	vector<float>		positions		(4*vertexCount*m_primitiveCount);
	vector<deUint16>	indices			(indexCount*m_primitiveCount);
	de::Random			rng				(1234);

	for (int primNdx = 0; primNdx < m_primitiveCount; primNdx++)
	{
		const float dx = m_primitiveCount>1 ? rng.getFloat() : 0.0f;
		const float dy = m_primitiveCount>1 ? rng.getFloat() : 0.0f;

		for (int vertNdx = 0; vertNdx < vertexCount; vertNdx++)
		{
			const int ndx = primNdx*4*vertexCount + vertNdx*4;
			positions[ndx+0] = (basePositions[vertNdx*2 + 0]*scale + dx)*primitiveArea.z() + primitiveArea.x();
			positions[ndx+1] = (basePositions[vertNdx*2 + 1]*scale + dy)*primitiveArea.w() + primitiveArea.y();
			positions[ndx+2] = 0.2f;
			positions[ndx+3] = 1.0f;
		}

		for (int ndx = 0; ndx < indexCount; ndx++)
			indices[primNdx*indexCount + ndx] = (deUint16)(baseIndices[ndx] + primNdx*vertexCount);
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.m_data);

	switch (m_primitiveType)
	{
		case TRIANGLE:	drawPrimitives(gl, program, GL_TRIANGLES,	positions, indices);	break;
		case LINE:		drawPrimitives(gl, program, GL_LINES,		positions, indices);	break;
		case POINT:		drawPrimitives(gl, program, GL_POINTS,		positions, indices);	break;
		default:		DE_ASSERT(false);													break;
	}
}